

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roipooling.cpp
# Opt level: O3

int __thiscall
ncnn::ROIPooling::forward
          (ROIPooling *this,vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *bottom_blobs,
          vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *top_blobs,Option *opt)

{
  long lVar1;
  float fVar2;
  uint uVar3;
  uint uVar4;
  uint _c;
  pointer pMVar5;
  Mat *this_00;
  void *pvVar6;
  size_t sVar7;
  float *pfVar8;
  size_t sVar9;
  void *pvVar10;
  int iVar11;
  uint uVar12;
  ulong uVar13;
  long lVar14;
  int iVar15;
  long lVar16;
  uint uVar17;
  long lVar18;
  uint uVar19;
  ulong uVar20;
  long lVar21;
  uint uVar22;
  uint uVar23;
  int iVar24;
  uint uVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  ulong local_98;
  void *local_90;
  void *local_88;
  
  pMVar5 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
           super__Vector_impl_data._M_start;
  uVar3 = pMVar5->w;
  uVar13 = (ulong)(int)uVar3;
  uVar4 = pMVar5->h;
  _c = pMVar5->c;
  this_00 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
            super__Vector_impl_data._M_start;
  Mat::create(this_00,this->pooled_width,this->pooled_height,_c,pMVar5->elemsize,opt->blob_allocator
             );
  pvVar6 = this_00->data;
  iVar11 = -100;
  if ((pvVar6 != (void *)0x0) && (sVar7 = this_00->cstep, (long)this_00->c * sVar7 != 0)) {
    pfVar8 = (float *)pMVar5[1].data;
    fVar29 = this->spatial_scale;
    fVar26 = roundf(*pfVar8 * fVar29);
    fVar27 = roundf(pfVar8[1] * fVar29);
    fVar28 = roundf(pfVar8[2] * fVar29);
    fVar29 = roundf(fVar29 * pfVar8[3]);
    iVar24 = (int)fVar28 - (int)fVar26;
    iVar11 = 0;
    if (iVar24 < 1) {
      iVar24 = 0;
    }
    iVar15 = (int)fVar29 - (int)fVar27;
    if (iVar15 < 1) {
      iVar15 = 0;
    }
    if (0 < (int)_c) {
      iVar11 = this->pooled_width;
      fVar28 = (float)(iVar24 + 1) / (float)iVar11;
      iVar24 = this->pooled_height;
      lVar14 = pMVar5->cstep * pMVar5->elemsize;
      sVar9 = this_00->elemsize;
      fVar30 = (float)(iVar15 + 1) / (float)iVar24;
      fVar29 = (float)(int)fVar27;
      pvVar10 = pMVar5->data;
      fVar26 = (float)(int)fVar26;
      local_98 = 0;
      local_90 = pvVar10;
      do {
        if (0 < iVar24) {
          local_88 = (void *)(sVar7 * sVar9 * local_98 + (long)pvVar6);
          iVar15 = 0;
          do {
            if (0 < iVar11) {
              fVar27 = floorf((float)iVar15 * fVar30);
              uVar25 = (uint)(fVar27 + fVar29);
              fVar27 = ceilf((float)(iVar15 + 1) * fVar30);
              uVar22 = (uint)(fVar27 + fVar29);
              if ((int)uVar25 < 1) {
                uVar25 = 0;
              }
              uVar17 = uVar25;
              if ((int)uVar4 < (int)uVar25) {
                uVar17 = uVar4;
              }
              if ((int)uVar22 < 1) {
                uVar22 = 0;
              }
              if ((int)uVar4 < (int)uVar22) {
                uVar22 = uVar4;
              }
              lVar18 = 0;
              do {
                fVar27 = floorf((float)(int)lVar18 * fVar28);
                uVar23 = (uint)(fVar27 + fVar26);
                lVar1 = lVar18 + 1;
                fVar27 = ceilf((float)(int)lVar1 * fVar28);
                uVar12 = (uint)(fVar27 + fVar26);
                if ((int)uVar23 < 1) {
                  uVar23 = 0;
                }
                uVar19 = uVar23;
                if ((int)uVar3 < (int)uVar23) {
                  uVar19 = uVar3;
                }
                if ((int)uVar12 < 1) {
                  uVar12 = 0;
                }
                if ((int)uVar3 < (int)uVar12) {
                  uVar12 = uVar3;
                }
                fVar27 = 0.0;
                if (((int)uVar25 < (int)uVar22) && ((int)uVar23 < (int)uVar12)) {
                  fVar27 = *(float *)((long)pvVar10 +
                                     (long)(int)(uVar17 * uVar3 + uVar19) * 4 + lVar14 * local_98);
                }
                if ((int)uVar25 < (int)uVar22) {
                  uVar20 = (ulong)uVar23;
                  if ((long)uVar13 <= (long)(ulong)uVar23) {
                    uVar20 = uVar13;
                  }
                  lVar16 = (long)local_90 + uVar20 * 4 + uVar13 * 4 * (ulong)uVar25;
                  uVar20 = (ulong)uVar25;
                  do {
                    if ((int)uVar23 < (int)uVar12) {
                      lVar21 = 0;
                      do {
                        fVar2 = *(float *)(lVar16 + lVar21 * 4);
                        if (fVar27 <= fVar2) {
                          fVar27 = fVar2;
                        }
                        lVar21 = lVar21 + 1;
                      } while (uVar12 - uVar19 != (int)lVar21);
                    }
                    uVar20 = uVar20 + 1;
                    lVar16 = lVar16 + uVar13 * 4;
                  } while ((uVar25 + uVar22) - uVar17 != (int)uVar20);
                }
                *(float *)((long)local_88 + lVar18 * 4) = fVar27;
                lVar18 = lVar1;
              } while (lVar1 != iVar11);
            }
            iVar15 = iVar15 + 1;
            local_88 = (void *)((long)local_88 + (long)iVar11 * 4);
          } while (iVar15 != iVar24);
        }
        local_98 = local_98 + 1;
        local_90 = (void *)((long)local_90 + lVar14);
      } while (local_98 != _c);
      iVar11 = 0;
    }
  }
  return iVar11;
}

Assistant:

int ROIPooling::forward(const std::vector<Mat>& bottom_blobs, std::vector<Mat>& top_blobs, const Option& opt) const
{
    const Mat& bottom_blob = bottom_blobs[0];
    int w = bottom_blob.w;
    int h = bottom_blob.h;
    size_t elemsize = bottom_blob.elemsize;
    int channels = bottom_blob.c;

    const Mat& roi_blob = bottom_blobs[1];

    Mat& top_blob = top_blobs[0];
    top_blob.create(pooled_width, pooled_height, channels, elemsize, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    // For each ROI R = [x y w h]: max pool over R
    const float* roi_ptr = roi_blob;

    int roi_x1 = static_cast<int>(round(roi_ptr[0] * spatial_scale));
    int roi_y1 = static_cast<int>(round(roi_ptr[1] * spatial_scale));
    int roi_x2 = static_cast<int>(round(roi_ptr[2] * spatial_scale));
    int roi_y2 = static_cast<int>(round(roi_ptr[3] * spatial_scale));

    int roi_w = std::max(roi_x2 - roi_x1 + 1, 1);
    int roi_h = std::max(roi_y2 - roi_y1 + 1, 1);

    float bin_size_w = (float)roi_w / (float)pooled_width;
    float bin_size_h = (float)roi_h / (float)pooled_height;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        const float* ptr = bottom_blob.channel(q);
        float* outptr = top_blob.channel(q);

        for (int ph = 0; ph < pooled_height; ph++)
        {
            for (int pw = 0; pw < pooled_width; pw++)
            {
                // Compute pooling region for this output unit:
                //  start (included) = floor(ph * roi_height / pooled_height)
                //  end (excluded) = ceil((ph + 1) * roi_height / pooled_height)
                int hstart = static_cast<int>(roi_y1 + floorf(ph * bin_size_h));
                int wstart = static_cast<int>(roi_x1 + floorf(pw * bin_size_w));
                int hend = static_cast<int>(roi_y1 + ceilf((ph + 1) * bin_size_h));
                int wend = static_cast<int>(roi_x1 + ceilf((pw + 1) * bin_size_w));

                hstart = std::min(std::max(hstart, 0), h);
                wstart = std::min(std::max(wstart, 0), w);
                hend = std::min(std::max(hend, 0), h);
                wend = std::min(std::max(wend, 0), w);

                bool is_empty = (hend <= hstart) || (wend <= wstart);

                float max = is_empty ? 0.f : ptr[hstart * w + wstart];

                for (int y = hstart; y < hend; y++)
                {
                    for (int x = wstart; x < wend; x++)
                    {
                        int index = y * w + x;
                        max = std::max(max, ptr[index]);
                    }
                }

                outptr[pw] = max;
            }

            outptr += pooled_width;
        }
    }

    return 0;
}